

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::astc_pack_block_cem_12_weight_range2(uint32_t *pOutput,astc_block_params *pBlock)

{
  uint uVar1;
  uint uVar2;
  long in_RSI;
  undefined1 *in_RDI;
  uint32_t ofs;
  uint32_t i;
  int bit_pos;
  uint8_t *pBytes;
  int in_stack_0000003c;
  int *in_stack_00000040;
  uint8_t *in_stack_00000048;
  uint32_t *in_stack_00000050;
  uint local_20;
  
  *in_RDI = 0x42;
  in_RDI[1] = 0x84;
  in_RDI[2] = 1;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0xc0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  astc_encode_trits(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  astc_encode_trits(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  for (local_20 = 0; local_20 < 0x20; local_20 = local_20 + 1) {
    uVar1 = local_20 * -2 + 0x7e;
    uVar2 = uVar1 >> 3;
    in_RDI[uVar2] =
         in_RDI[uVar2] | ""[*(byte *)(in_RSI + 10 + (ulong)local_20)] << ((byte)uVar1 & 7);
  }
  return;
}

Assistant:

static void astc_pack_block_cem_12_weight_range2(uint32_t *pOutput, const astc_block_params* pBlock)
	{
		uint8_t* pBytes = reinterpret_cast<uint8_t*>(pOutput);

		// Write constant block mode, color component selector, number of partitions, color endpoint mode
		// https://www.khronos.org/registry/DataFormat/specs/1.2/dataformat.1.2.html#_block_mode
		pBytes[0] = 0x42; pBytes[1] = 0x84; pBytes[2] = 0x01; pBytes[3] = 0x00;
		pBytes[4] = 0x00; pBytes[5] = 0x00; pBytes[6] = 0x00; pBytes[7] = 0xc0;

		pOutput[2] = 0;
		pOutput[3] = 0;

		// Pack 8 endpoints (each ranging between [0,47]) using BISE starting at bit 17
		int bit_pos = 17;
		astc_encode_trits(pOutput, pBlock->m_endpoints, bit_pos, 4);
		astc_encode_trits(pOutput, pBlock->m_endpoints + 5, bit_pos, 4);

		// Pack 32 2-bit weights, which are stored from the top down into the block in opposite bit order.
				
		for (uint32_t i = 0; i < 32; i++)
		{
			static const uint8_t s_reverse_bits[4] = { 0, 2, 1, 3 };
			const uint32_t ofs = 126 - (i * 2);
			pBytes[ofs >> 3] |= (s_reverse_bits[pBlock->m_weights[i]] << (ofs & 7));
		}
	}